

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testComparators<Imath_3_2::Vec3<long>>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  Box<Imath_3_2::Vec3<long>_> *src;
  Box<Imath_3_2::Vec3<long>_> *pBVar6;
  Vec3<long> *maxT;
  Vec3<long> *pVVar7;
  char *in_RDI;
  Box<Imath_3_2::Vec3<long>_> b2;
  Box<Imath_3_2::Vec3<long>_> b1_2;
  Box<Imath_3_2::Vec3<long>_> b0_2;
  Vec3<long> p3;
  Vec3<long> p2;
  Vec3<long> p1_1;
  Vec3<long> p0_1;
  uint j_1;
  uint i_1;
  vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> perms_1;
  Box<Imath_3_2::Vec3<long>_> b1_1;
  Box<Imath_3_2::Vec3<long>_> b0_1;
  Vec3<long> p1;
  Vec3<long> p0;
  uint j;
  uint i;
  vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> perms;
  Box<Imath_3_2::Vec3<long>_> b1;
  Box<Imath_3_2::Vec3<long>_> b0;
  Rand32 rand;
  Vec3<long> *in_stack_fffffffffffffd88;
  Box<Imath_3_2::Vec3<long>_> *in_stack_fffffffffffffd90;
  Box<Imath_3_2::Vec3<long>_> *in_stack_fffffffffffffd98;
  Box<Imath_3_2::Vec3<long>_> *in_stack_fffffffffffffda0;
  Box<Imath_3_2::Vec3<long>_> *this;
  vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *in_stack_fffffffffffffdd0;
  Vec3<long> local_1b0 [2];
  Vec3<long> local_180 [2];
  uint local_150;
  uint local_14c;
  Box<Imath_3_2::Vec3<long>_> local_148 [2];
  Vec3<long> local_d0 [2];
  uint local_9c;
  uint local_98;
  vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> local_88 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    comparators for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand32::Rand32
            ((Rand32 *)in_stack_fffffffffffffd90,(unsigned_long)in_stack_fffffffffffffd88);
  Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box(in_stack_fffffffffffffd90);
  Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box(in_stack_fffffffffffffd90);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (!bVar1) {
    __assert_fail("b0 == b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x179,
                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                 );
  }
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 != b1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x17a,
                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                 );
  }
  std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::vector
            ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)0x11c038);
  permutations<Imath_3_2::Vec3<long>>(in_stack_fffffffffffffdd0);
  for (local_98 = 0; uVar3 = (ulong)local_98,
      sVar4 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::size
                        (local_88), uVar3 < sVar4; local_98 = local_98 + 1) {
    for (local_9c = 0; uVar3 = (ulong)local_9c,
        sVar4 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::size
                          (local_88), uVar3 < sVar4; local_9c = local_9c + 1) {
      std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::operator[]
                (local_88,(ulong)local_98);
      Imath_3_2::Vec3<long>::operator-(in_stack_fffffffffffffd88);
      pvVar5 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::
               operator[](local_88,(ulong)local_9c);
      Imath_3_2::Vec3<long>::Vec3(local_d0,pvVar5);
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box(in_stack_fffffffffffffd90);
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                (in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->min,
                 &in_stack_fffffffffffffd90->min);
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                        (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!(b0 == b1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x18d,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                     );
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                        (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if (!bVar1) {
        __assert_fail("b0 != b1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x18e,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                     );
      }
    }
  }
  std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::~vector
            ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
             in_stack_fffffffffffffda0);
  this = local_148;
  std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::vector
            ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)0x11c213);
  permutations<Imath_3_2::Vec3<long>>(in_stack_fffffffffffffdd0);
  local_14c = 0;
  do {
    src = (Box<Imath_3_2::Vec3<long>_> *)(ulong)local_14c;
    pBVar6 = (Box<Imath_3_2::Vec3<long>_> *)
             std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::size
                       ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
                        local_148);
    if (pBVar6 <= src) {
      std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::~vector
                ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)this);
      return;
    }
    local_150 = 0;
    while( true ) {
      maxT = (Vec3<long> *)(ulong)local_150;
      pVVar7 = (Vec3<long> *)
               std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::size
                         ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
                          local_148);
      if (pVVar7 <= maxT) break;
      std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::operator[]
                ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)local_148
                 ,(ulong)local_14c);
      Imath_3_2::Vec3<long>::operator-(in_stack_fffffffffffffd88);
      pvVar5 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::
               operator[]((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
                          local_148,(ulong)local_150);
      Imath_3_2::Vec3<long>::Vec3(local_180,pvVar5);
      std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::operator[]
                ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)local_148
                 ,(ulong)local_150);
      Imath_3_2::Vec3<long>::operator-(in_stack_fffffffffffffd88);
      pvVar5 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::
               operator[]((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
                          local_148,(ulong)local_14c);
      Imath_3_2::Vec3<long>::Vec3(local_1b0,pvVar5);
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box(this,&src->min,maxT);
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box(this,&src->min,maxT);
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box(this,&src->min,maxT);
      if (local_14c == local_150) {
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==(this,src);
        if (!bVar1) {
          __assert_fail("b0 == b1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1aa,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                       );
        }
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=(this,src);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!(b0 != b1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1ab,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                       );
        }
      }
      else {
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=(this,src);
        if (!bVar1) {
          __assert_fail("b0 != b1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1af,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                       );
        }
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==(this,src);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!(b0 == b1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1b0,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                       );
        }
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==(this,src);
      if (!bVar1) {
        __assert_fail("b0 == b2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x1b2,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                     );
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=(this,src);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!(b0 != b2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x1b3,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                     );
      }
      local_150 = local_150 + 1;
    }
    local_14c = local_14c + 1;
  } while( true );
}

Assistant:

void
testComparators (const char* type)
{
    cout << "    comparators for type " << type << endl;

    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);

    //
    // Compare empty.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0;
        IMATH_INTERNAL_NAMESPACE::Box<T> b1;

        assert (b0 == b1);
        assert (!(b0 != b1));
    }

    //
    // Compare empty to non-empty.
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
                assert (!(b0 == b1));
                assert (b0 != b1);
            }
        }
    }

    //
    // Compare two non-empty
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                T p2 = -perms[j];
                T p3 = perms[i];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0 (p0, p1);
                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p2, p3);
                IMATH_INTERNAL_NAMESPACE::Box<T> b2 (p0, p1);

                if (i == j)
                {
                    assert (b0 == b1);
                    assert (!(b0 != b1));
                }
                else
                {
                    assert (b0 != b1);
                    assert (!(b0 == b1));
                }
                assert (b0 == b2);
                assert (!(b0 != b2));
            }
        }
    }
}